

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O0

shared_ptr<Instance> __thiscall Individual::getUsedInstance(Individual *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<Instance> sVar1;
  Individual *this_local;
  
  std::shared_ptr<Instance>::shared_ptr
            ((shared_ptr<Instance> *)this,(shared_ptr<Instance> *)(in_RSI + 0x18));
  sVar1.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Instance>)sVar1.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instance> Individual::getUsedInstance() const {
	return usedInstance;
}